

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O3

int __thiscall JsonTest::Runner::runCommandLine(Runner *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  _Elt_pointer pp_Var4;
  ulong uVar5;
  int iVar6;
  _Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *this_00;
  uint unaff_R13D;
  uint testNameIndex;
  Runner subrunner;
  string opt;
  allocator local_dd;
  int local_dc;
  _Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *local_d8;
  uint local_cc;
  undefined1 local_c8 [32];
  _Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> local_a8;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_d8 = (_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_> *)
             this;
  std::_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>::
  _M_initialize_map(&local_a8,0);
  local_dc = argc;
  if (1 < argc) {
    iVar6 = 1;
    do {
      std::__cxx11::string::string((string *)local_50,argv[iVar6],(allocator *)local_c8);
      iVar2 = std::__cxx11::string::compare((char *)local_50);
      if (iVar2 == 0) {
        unaff_R13D = 0;
        listTests((Runner *)local_d8);
        bVar1 = false;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)local_50);
        if (iVar2 == 0) {
          bVar1 = true;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_50);
          if ((iVar2 == 0) && (iVar6 = iVar6 + 1, iVar6 < local_dc)) {
            std::__cxx11::string::string((string *)local_c8,argv[iVar6],&local_dd);
            bVar1 = testIndex((Runner *)local_d8,(string *)local_c8,&local_cc);
            if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
              operator_delete((void *)local_c8._0_8_);
            }
            if (bVar1) {
              pp_Var4 = (local_d8->_M_impl).super__Deque_impl_data._M_start._M_cur;
              uVar3 = ((long)pp_Var4 -
                       (long)(local_d8->_M_impl).super__Deque_impl_data._M_start._M_first >> 3) +
                      (ulong)local_cc;
              if ((long)uVar3 < 0) {
                uVar5 = (long)uVar3 >> 6;
LAB_0011c643:
                pp_Var4 = (local_d8->_M_impl).super__Deque_impl_data._M_start._M_node[uVar5] +
                          uVar3 + uVar5 * -0x40;
              }
              else {
                if (0x3f < uVar3) {
                  uVar5 = uVar3 >> 6;
                  goto LAB_0011c643;
                }
                pp_Var4 = pp_Var4 + local_cc;
              }
              local_c8._0_8_ = *pp_Var4;
              if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<JsonTest::TestCase*(*)(),std::allocator<JsonTest::TestCase*(*)()>>::
                _M_push_back_aux<JsonTest::TestCase*(*const&)()>
                          ((deque<JsonTest::TestCase*(*)(),std::allocator<JsonTest::TestCase*(*)()>>
                            *)&local_a8,(_func_TestCase_ptr **)local_c8);
              }
              else {
                *local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     (_func_TestCase_ptr *)local_c8._0_8_;
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
            else {
              runCommandLine();
              unaff_R13D = 2;
            }
          }
          else {
            bVar1 = false;
            printf("Usage: %s [options]\n\nIf --test is not specified, then all the test cases be run.\n\nValid options:\n--list-tests: print the name of all test cases on the standard\n              output and exit.\n--test TESTNAME: executes the test case with the specified name.\n                 May be repeated.\n--test-auto: prevent dialog prompting for debugging on crash.\n"
                   ,*argv);
            unaff_R13D = 2;
          }
        }
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (bVar1 == false) goto LAB_0011c708;
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_dc);
  }
  iVar6 = (int)((ulong)((long)local_a8._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
          (int)((ulong)((long)local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
          ((((uint)((int)local_a8._M_impl.super__Deque_impl_data._M_finish._M_node -
                   (int)local_a8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (uint)(local_a8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
          0x40;
  this_00 = &local_a8;
  if (iVar6 == 0) {
    this_00 = local_d8;
  }
  bVar1 = runAllTest((Runner *)this_00,iVar6 != 1);
  unaff_R13D = (uint)!bVar1;
LAB_0011c708:
  std::_Deque_base<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>::
  ~_Deque_base(&local_a8);
  return unaff_R13D;
}

Assistant:

int Runner::runCommandLine(int argc, const char* argv[]) const {
  // typedef std::deque<std::string> TestNames;
  Runner subrunner;
  for (int index = 1; index < argc; ++index) {
    std::string opt = argv[index];
    if (opt == "--list-tests") {
      listTests();
      return 0;
    } else if (opt == "--test-auto") {
      preventDialogOnCrash();
    } else if (opt == "--test") {
      ++index;
      if (index < argc) {
        unsigned int testNameIndex;
        if (testIndex(argv[index], testNameIndex)) {
          subrunner.add(tests_[testNameIndex]);
        } else {
          fprintf(stderr, "Test '%s' does not exist!\n", argv[index]);
          return 2;
        }
      } else {
        printUsage(argv[0]);
        return 2;
      }
    } else {
      printUsage(argv[0]);
      return 2;
    }
  }
  bool succeeded;
  if (subrunner.testCount() > 0) {
    succeeded = subrunner.runAllTest(subrunner.testCount() > 1);
  } else {
    succeeded = runAllTest(true);
  }
  return succeeded ? 0 : 1;
}